

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_parameterization_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::SurfaceCornerParameterizationQuantity::fillCoordBuffers
          (SurfaceCornerParameterizationQuantity *this,ShaderProgram *p)

{
  long *in_RSI;
  ManagedBuffer<unsigned_int> *unaff_retaddr;
  ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_> *in_stack_00000008;
  undefined1 local_58 [39];
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"a_value2",&local_31);
  render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            (in_stack_00000008,unaff_retaddr);
  (**(code **)(*in_RSI + 0x98))(in_RSI,local_30,local_58);
  std::shared_ptr<polyscope::render::AttributeBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::AttributeBuffer> *)0x49bf79);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void SurfaceCornerParameterizationQuantity::fillCoordBuffers(render::ShaderProgram& p) {
  p.setAttribute("a_value2", coords.getIndexedRenderAttributeBuffer(parent.triangleCornerInds));
}